

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O1

bool google::protobuf::internal::
     SplitFieldHasExtraIndirectionStatic<google::protobuf::RepeatedField<bool>>
               (FieldDescriptor *field)

{
  bool bVar1;
  internal local_10 [16];
  
  bVar1 = SplitFieldHasExtraIndirection(field);
  if (bVar1) {
    return true;
  }
  SplitFieldHasExtraIndirectionStatic<google::protobuf::RepeatedField<bool>>(local_10);
}

Assistant:

bool SplitFieldHasExtraIndirectionStatic(const FieldDescriptor* field) {
  if (std::is_base_of<RepeatedFieldBase, T>() ||
      std::is_base_of<RepeatedPtrFieldBase, T>()) {
    ABSL_DCHECK(SplitFieldHasExtraIndirection(field));
    return true;
  } else if (std::is_base_of<MessageLite, T>()) {
    ABSL_DCHECK(!SplitFieldHasExtraIndirection(field));
    return false;
  }
  return SplitFieldHasExtraIndirection(field);
}